

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  char cVar1;
  istream *piVar2;
  size_type __n;
  size_type __n_00;
  ostream *poVar3;
  char *pcVar4;
  reference this;
  reference pvVar5;
  string local_d0;
  bool local_ad;
  int local_ac;
  string local_a8 [3];
  bool explore;
  int j;
  string ROW;
  int i;
  pos_t end;
  pos_t pos;
  int KC;
  int KR;
  bool back;
  allocator<ECell> local_55;
  value_type local_54;
  vector<ECell,_std::allocator<ECell>_> local_50;
  undefined1 local_38 [8];
  field_t field;
  int iStack_18;
  bool first_step;
  pair<int,_int> local_14;
  pos_t start;
  
  start.first = 0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&R);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&C);
  std::istream::operator>>(piVar2,&A);
  std::istream::ignore();
  iStack_18 = -1;
  field.
  super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  std::pair<int,_int>::pair<int,_int,_true>
            (&local_14,&stack0xffffffffffffffe8,
             (int *)((long)&field.
                            super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  field.
  super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  __n = (size_type)R;
  __n_00 = (size_type)C;
  local_54 = EC_UNKNOWN;
  std::allocator<ECell>::allocator(&local_55);
  std::vector<ECell,_std::allocator<ECell>_>::vector(&local_50,__n_00,&local_54,&local_55);
  std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>::allocator
            ((allocator<std::vector<ECell,_std::allocator<ECell>_>_> *)((long)&KC + 3));
  std::
  vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ::vector((vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
            *)local_38,__n,&local_50,
           (allocator<std::vector<ECell,_std::allocator<ECell>_>_> *)((long)&KC + 3));
  std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>::~allocator
            ((allocator<std::vector<ECell,_std::allocator<ECell>_>_> *)((long)&KC + 3));
  std::vector<ECell,_std::allocator<ECell>_>::~vector(&local_50);
  std::allocator<ECell>::~allocator(&local_55);
  KC._2_1_ = 0;
  do {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&pos.second);
    std::istream::operator>>(piVar2,&pos.first);
    std::istream::ignore();
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&end,&pos.second,&pos.first);
    std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&stack0xffffffffffffff80);
    for (ROW.field_2._12_4_ = 0; (int)ROW.field_2._12_4_ < R;
        ROW.field_2._12_4_ = ROW.field_2._12_4_ + 1) {
      std::__cxx11::string::string(local_a8);
      std::operator>>((istream *)&std::cin,local_a8);
      std::istream::ignore();
      poVar3 = std::operator<<((ostream *)&std::cerr,local_a8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      for (local_ac = 0; local_ac < C; local_ac = local_ac + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
        cVar1 = *pcVar4;
        this = std::
               vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
               ::operator[]((vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                             *)local_38,(long)(int)ROW.field_2._12_4_);
        pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](this,(long)local_ac);
        *pvVar5 = (int)cVar1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
        if ((*pcVar4 == 'T') &&
           ((field.
             super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0)) {
          std::pair<int,_int>::operator=(&local_14,&end);
          field.
          super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        }
      }
      std::__cxx11::string::~string(local_a8);
    }
    local_ad = true;
    step_abi_cxx11_(&local_d0,(field_t *)local_38,&end,(bool *)((long)&KC + 2),&local_ad);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_d0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d0);
  } while( true );
}

Assistant:

int main()
{
    std::cin >> R >> C >> A;
    std::cin.ignore();

    pos_t start(-1, -1);
    bool first_step = true;
    
    field_t field(R, row_t(C, EC_UNKNOWN));
    bool back = false;
    // game loop
    while (1)
    {
        int KR; // row where Kirk is located.
        int KC; // column where Kirk is located.
        std::cin >> KR >> KC;
        std::cin.ignore();
        
        pos_t pos(KR, KC);
        pos_t end;

        for (int i = 0; i < R; i++)
        {
            std::string ROW; // C of the characters in '#.TC?' (i.e. one line of the ASCII maze).
            std::cin >> ROW;
            std::cin.ignore();
            
            std::cerr << ROW << std::endl;
            for (int j = 0; j < C; j++)
            {
                field[i][j] = static_cast<ECell>(ROW[j]);
                if (EC_START == ROW[j])
                {
                    if (first_step)
                    {
                        start = pos;
                        first_step = false;
                    }
                }
            }
        }
        
        bool explore = true;
        std::cout << step(field, pos, back, explore) << std::endl;
    }
}